

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O3

void lzma_lzma_optimum_fast
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  uint8_t *puVar1;
  lzma_mf *plVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint32_t uVar16;
  ulong uVar17;
  uint32_t matches_count;
  uint local_64;
  uint32_t *local_60;
  uint32_t *local_58;
  lzma_mf *local_50;
  lzma_match *local_48;
  ulong local_40;
  uint8_t *local_38;
  ulong uVar18;
  
  uVar8 = mf->nice_len;
  if (mf->read_ahead == 1) {
    local_64 = coder->matches_count;
    uVar3 = coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x26,
                    "void lzma_lzma_optimum_fast(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar3 = lzma_mf_find(mf,&local_64,coder->matches);
  }
  uVar14 = (ulong)mf->read_pos;
  uVar4 = (mf->write_pos - mf->read_pos) + 1;
  if (uVar4 < 2) {
    *back_res = 0xffffffff;
    *len_res = 1;
    return;
  }
  puVar1 = mf->buffer;
  uVar6 = 0x111;
  if (uVar4 < 0x111) {
    uVar6 = uVar4;
  }
  uVar9 = 3;
  if (3 < uVar6) {
    uVar9 = (ulong)uVar6;
  }
  uVar10 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    local_60 = back_res;
    local_58 = len_res;
    local_50 = mf;
    local_38 = puVar1;
    if (*(short *)(puVar1 + (uVar14 - 1)) ==
        *(short *)(puVar1 + (uVar14 - coder->reps[uVar10]) + -2)) {
      uVar18 = 2;
      if (uVar4 != 2) {
        uVar17 = 2;
        do {
          uVar18 = uVar17;
          if (puVar1[uVar17 + (uVar14 - 1)] != puVar1[uVar17 + (uVar14 - coder->reps[uVar10]) + -2])
          break;
          uVar17 = uVar17 + 1;
          uVar18 = uVar9;
        } while (uVar9 != uVar17);
      }
      uVar15 = (uint)uVar18;
      if (uVar8 <= uVar15) {
        *back_res = (uint32_t)uVar10;
        *len_res = uVar15;
        uVar3 = uVar15 - 1;
        if (uVar3 == 0) {
          return;
        }
        goto LAB_0019fda1;
      }
      if (uVar6 < uVar15) {
        uVar7 = uVar10 & 0xffffffff;
        uVar6 = uVar15;
      }
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  if (uVar3 < uVar8) {
    uVar16 = 0;
    if (1 < uVar3) {
      uVar9 = (ulong)local_64;
      uVar16 = coder->matches[local_64 - 1].dist;
      if (1 < uVar9) {
        puVar11 = &coder->matches[uVar9 - 2].dist;
        do {
          uVar8 = ((lzma_match *)(puVar11 + -1))->len;
          if ((uVar3 != uVar8 + 1) || (uVar15 = *puVar11, uVar16 >> 7 <= uVar15)) break;
          local_64 = (int)uVar9 - 1;
          uVar9 = (ulong)local_64;
          puVar11 = puVar11 + -2;
          uVar3 = uVar8;
          uVar16 = uVar15;
        } while (1 < local_64);
      }
      uVar8 = 1;
      if (uVar16 < 0x80) {
        uVar8 = uVar3;
      }
      if (uVar3 == 2) {
        uVar3 = uVar8;
      }
    }
    if ((1 < uVar6) &&
       (((uVar3 <= uVar6 + 1 || ((uVar3 <= uVar6 + 2 && (0x200 < uVar16)))) ||
        ((uVar3 <= uVar6 + 3 && (0x8000 < uVar16)))))) {
      *back_res = (uint32_t)uVar7;
      *len_res = uVar6;
      (*mf->skip)(mf,uVar6 - 1);
      mf->read_ahead = mf->read_ahead + (uVar6 - 1);
      return;
    }
    if ((uVar4 != 2) && (1 < uVar3)) {
      local_48 = coder->matches;
      local_40 = uVar14;
      uVar5 = lzma_mf_find(mf,&coder->matches_count,local_48);
      coder->longest_match_length = uVar5;
      if (uVar5 < 2) {
LAB_0019fe5f:
        lVar12 = 0;
        do {
          if (*(short *)(local_38 + local_40) ==
              *(short *)(puVar1 + ~(ulong)coder->reps[lVar12] + uVar14)) {
            if (uVar3 - 1 < 3) goto LAB_0019fe06;
            lVar13 = 0;
            while (*(uint8_t *)((long)(local_38 + local_40) + lVar13 + 2) ==
                   puVar1[lVar13 + ((uVar14 + 1) - (ulong)coder->reps[lVar12])]) {
              lVar13 = lVar13 + 1;
              if ((ulong)(uVar3 - 1) - 2 == lVar13) goto LAB_0019fe06;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        *local_60 = uVar16 + 4;
        *local_58 = uVar3;
        uVar3 = uVar3 - 2;
        goto joined_r0x0019fd8d;
      }
      uVar8 = local_48[coder->matches_count - 1].dist;
      if ((uVar5 < uVar3) || (uVar16 <= uVar8)) {
        if (((uVar5 <= uVar3 + 1) && (uVar5 != uVar3 + 1 || uVar16 < uVar8 >> 7)) &&
           (((uVar3 < 3 || (uVar5 + 1 < uVar3)) || (uVar16 >> 7 <= uVar8)))) goto LAB_0019fe5f;
      }
    }
LAB_0019fe06:
    *local_60 = 0xffffffff;
    *local_58 = 1;
  }
  else {
    *back_res = coder->matches[local_64 - 1].dist + 4;
    *len_res = uVar3;
    uVar3 = uVar3 - 1;
joined_r0x0019fd8d:
    if (uVar3 != 0) {
LAB_0019fda1:
      plVar2 = local_50;
      (*local_50->skip)(local_50,uVar3);
      plVar2->read_ahead = plVar2->read_ahead + uVar3;
    }
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res)
{
	const uint8_t *buf;
	uint32_t buf_avail;
	uint32_t i;
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;
	uint32_t back_main = 0;
	uint32_t limit;

	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	buf = mf_ptr(mf) - 1;
	buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		for (len = 2; len < buf_avail
				&& buf[len] == buf_back[len]; ++len) ;

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist
				+ REP_DISTANCES;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	limit = len_main - 1;

	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back))
			continue;

		for (len = 2; len < limit
				&& buf[len] == buf_back[len]; ++len) ;

		if (len >= limit) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REP_DISTANCES;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}